

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLTokenizer.hpp
# Opt level: O0

HLSLTokenInfo *
Diligent::Parsing::HLSLTokenInfo::Create
          (HLSLTokenInfo *__return_storage_ptr__,TokenType _Type,const_iterator *DelimStart,
          const_iterator *DelimEnd,const_iterator *LiteralStart,const_iterator *LiteralEnd,
          size_t Idx)

{
  allocator<char> local_b1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  string local_a0;
  allocator<char> local_69;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_58;
  const_iterator *local_38;
  const_iterator *LiteralEnd_local;
  const_iterator *LiteralStart_local;
  const_iterator *DelimEnd_local;
  const_iterator *DelimStart_local;
  HLSLTokenInfo *pHStack_10;
  TokenType _Type_local;
  
  local_60._M_current = LiteralStart->_M_current;
  local_68._M_current = LiteralEnd->_M_current;
  local_38 = LiteralEnd;
  LiteralEnd_local = LiteralStart;
  LiteralStart_local = DelimEnd;
  DelimEnd_local = DelimStart;
  DelimStart_local._4_4_ = _Type;
  pHStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)&local_58,local_60,local_68,&local_69);
  local_a8._M_current = DelimEnd_local->_M_current;
  local_b0._M_current = LiteralStart_local->_M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)&local_a0,local_a8,local_b0,&local_b1);
  HLSLTokenInfo(__return_storage_ptr__,_Type,&local_58,&local_a0,Idx);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

static HLSLTokenInfo Create(TokenType                          _Type,
                                const std::string::const_iterator& DelimStart,
                                const std::string::const_iterator& DelimEnd,
                                const std::string::const_iterator& LiteralStart,
                                const std::string::const_iterator& LiteralEnd,
                                size_t                             Idx)
    {
        return HLSLTokenInfo{_Type, std::string{LiteralStart, LiteralEnd}, std::string{DelimStart, DelimEnd}, Idx};
    }